

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong_test.c
# Opt level: O0

void mu_cv_unexpired_deadline_ping_pong(ping_pong *pp,int parity)

{
  nsync_time nVar1;
  nsync_time b;
  nsync_time deadline_in1hour;
  int parity_local;
  ping_pong *pp_local;
  
  nVar1 = nsync_time_now();
  b = nsync_time_ms(3600000);
  nVar1 = nsync_time_add(nVar1,b);
  nsync_mu_lock(&pp->mu);
  while (pp->i < pp->limit) {
    while ((pp->i & 1U) == parity) {
      nsync_cv_wait_with_deadline(pp->cv + parity,&pp->mu,nVar1,(nsync_note)0x0);
    }
    pp->i = pp->i + 1;
    nsync_cv_signal(pp->cv + (1 - parity));
  }
  nsync_mu_unlock(&pp->mu);
  ping_pong_done(pp);
  return;
}

Assistant:

static void mu_cv_unexpired_deadline_ping_pong (ping_pong *pp, int parity) {
	nsync_time deadline_in1hour;
	deadline_in1hour = nsync_time_add (nsync_time_now (), nsync_time_ms (3600000));
	nsync_mu_lock (&pp->mu);
	while (pp->i < pp->limit) {
		while ((pp->i & 1) == parity) {
			nsync_cv_wait_with_deadline (&pp->cv[parity], &pp->mu,
						     deadline_in1hour, NULL);
		}
		pp->i++;
		nsync_cv_signal (&pp->cv[1 - parity]);
	}
	nsync_mu_unlock (&pp->mu);
	ping_pong_done (pp);
}